

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_displaceselection(_glist *x,int dx,int dy)

{
  t_pd p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  void *data;
  _selection *p_Var5;
  
  p_Var5 = x->gl_editor->e_selection;
  if (p_Var5 != (t_selection *)0x0) {
    if (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x40) == 0) {
      data = canvas_undo_set_move(x,1);
      canvas_undo_add(x,UNDO_MOTION,"motion",data);
      *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 1;
      p_Var5 = x->gl_editor->e_selection;
      if (p_Var5 == (t_selection *)0x0) goto LAB_0013d517;
    }
    bVar2 = false;
    bVar4 = false;
    do {
      p_Var1 = p_Var5->sel_what->g_pd;
      gobj_displace(p_Var5->sel_what,x,dx,dy);
      bVar3 = true;
      if (p_Var1 != voutlet_class) {
        bVar3 = bVar4;
      }
      if (p_Var1 == vinlet_class) {
        bVar2 = true;
        bVar3 = bVar4;
      }
      p_Var5 = p_Var5->sel_next;
      bVar4 = bVar3;
    } while (p_Var5 != (_selection *)0x0);
    if (bVar2) {
      canvas_resortinlets(x);
    }
    if (bVar3) {
      canvas_resortoutlets(x);
    }
  }
LAB_0013d517:
  pdgui_vmess("pdtk_canvas_getscroll","c",x);
  if (x->gl_editor->e_selection != (t_selection *)0x0) {
    canvas_dirty(x,1.0);
    return;
  }
  return;
}

Assistant:

static void canvas_displaceselection(t_canvas *x, int dx, int dy)
{
    t_selection *y;
    int resortin = 0, resortout = 0;
    if (x->gl_editor->e_selection && !EDITOR->canvas_undo_already_set_move)
    {
        canvas_undo_add(x, UNDO_MOTION, "motion", canvas_undo_set_move(x, 1));
        EDITOR->canvas_undo_already_set_move = 1;
    }
    for (y = x->gl_editor->e_selection; y; y = y->sel_next)
    {
        t_class *cl = pd_class(&y->sel_what->g_pd);
        gobj_displace(y->sel_what, x, dx, dy);
        if (cl == vinlet_class) resortin = 1;
        else if (cl == voutlet_class) resortout = 1;
    }
    if (resortin) canvas_resortinlets(x);
    if (resortout) canvas_resortoutlets(x);
    pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (x->gl_editor->e_selection)
        canvas_dirty(x, 1);
}